

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Flatten.cpp
# Opt level: O3

void __thiscall wasm::Flatten::visitExpression(Flatten *this,Expression *curr)

{
  ExpressionList *pEVar1;
  Id IVar2;
  Id IVar3;
  byte bVar4;
  uintptr_t uVar5;
  undefined8 *puVar6;
  _Base_ptr p_Var7;
  pointer ppEVar8;
  iterator __position;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  pointer ppEVar16;
  size_t sVar17;
  bool bVar18;
  Index IVar19;
  Index index;
  int iVar20;
  ulong uVar21;
  iterator iVar22;
  Try *pTVar23;
  Type TVar24;
  LocalSet *pLVar25;
  Expression *pEVar26;
  __node_base_ptr p_Var27;
  Expression *pEVar28;
  Expression *pEVar29;
  Expression **ppEVar30;
  _Rb_tree_node_base *p_Var31;
  undefined4 extraout_var;
  mapped_type *pmVar32;
  vector<wasm::Expression*,std::allocator<wasm::Expression*>> *this_00;
  uintptr_t uVar33;
  Expression *expr;
  uint uVar34;
  Flatten *pFVar35;
  MixedArena *expression;
  byte *pbVar36;
  Type in_R8;
  Type type;
  undefined8 *puVar37;
  pointer ppEVar38;
  ulong uVar39;
  Name *pNVar40;
  Try *pTVar41;
  Iterator __first;
  optional<wasm::Type> type_;
  optional<wasm::Type> type__00;
  optional<wasm::Type> type__01;
  Iterator __last;
  undefined1 auStack_218 [8];
  Expression *prelude;
  _Base_ptr local_208;
  _Rb_tree_node_base *local_200;
  Expression *local_90;
  Try *local_88;
  Try *local_80;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_78;
  Try *local_58;
  Expression *curr_local;
  Expression *item;
  Flatten *local_40;
  Builder local_38;
  Builder builder;
  
  local_78.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (Expression **)0x0;
  local_78.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38.wasm =
       (this->
       super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
       ).
       super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
       .super_PostWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>.
       super_Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>.currModule;
  IVar2 = curr->_id;
  uVar34 = (uint)IVar2;
  pEVar29 = curr;
  if (uVar34 == 0x51) {
    do {
      if (1 < *(int *)(pEVar29 + 1) - 1U) goto LAB_0086091d;
      pEVar29 = (Expression *)pEVar29[1].type.id;
      IVar3 = pEVar29->_id;
      uVar34 = (uint)IVar3;
    } while (IVar3 == RefAsId);
  }
  if ((uVar34 - 0x29 < 0x2b) && ((0x40000000005U >> ((ulong)(uVar34 - 0x29) & 0x3f) & 1) != 0)) {
    return;
  }
  if (uVar34 == 0xe) {
    return;
  }
LAB_0086091d:
  item = (Expression *)
         &(this->
          super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
          ).
          super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
  ;
  local_58 = (Try *)curr;
  local_40 = this;
  if (IVar2 < 0x3a) {
    uVar21 = (ulong)(uint)IVar2;
    if ((0x3000000000000eU >> (uVar21 & 0x3f) & 1) != 0) {
      local_80 = (Try *)&this->preludes;
      iVar22 = std::
               _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               ::find((_Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       *)local_80,(key_type *)&local_58);
      pTVar41 = local_58;
      if (iVar22.
          super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_false>
          ._M_cur != (__node_type *)0x0) {
        __assert_fail("preludes.find(curr) == preludes.end()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Flatten.cpp"
                      ,0x66,"void wasm::Flatten::visitExpression(Expression *)");
      }
      IVar2 = (local_58->super_SpecificExpression<(wasm::Expression::Id)52>).super_Expression._id;
      if (IVar2 < LoopId) {
        if (IVar2 == BlockId) {
          local_200 = (_Rb_tree_node_base *)
                      &((this->
                        super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                        ).
                        super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                        .
                        super_PostWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                        .
                        super_Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                       .currModule)->allocator;
          prelude._0_4_ = 0;
          prelude._4_4_ = 0;
          local_208._0_4_ = 0;
          local_208._4_4_ = 0;
          auStack_218 = (undefined1  [8])0x0;
          prelude = (Expression *)0x0;
          local_208 = (_Base_ptr)0x0;
          local_90 = (Expression *)
                     (local_58->catchTags).
                     super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.data;
          if (local_90 == (Expression *)0x0) {
            pEVar29 = (Expression *)0x0;
            auStack_218 = (undefined1  [8])0x0;
          }
          else {
            local_88 = local_58;
            pNVar40 = (Name *)0x0;
            do {
              if ((local_88->catchTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.
                  data <= pNVar40) {
LAB_008615f4:
                __assert_fail("index < usedElements",
                              "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                              ,0xbc,
                              "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                             );
              }
              curr_local = (((ExpressionList *)&local_88->body)->
                           super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ).data[(long)pNVar40];
              iVar22 = std::
                       _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       ::find((_Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                               *)local_80,&curr_local);
              if (iVar22.
                  super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_false>
                  ._M_cur != (__node_type *)0x0) {
                puVar37 = *(undefined8 **)
                           ((long)iVar22.
                                  super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_false>
                                  ._M_cur + 0x10);
                puVar6 = *(undefined8 **)
                          ((long)iVar22.
                                 super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_false>
                                 ._M_cur + 0x18);
                if (puVar37 != puVar6) {
                  do {
                    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                              ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                *)auStack_218,(Expression *)*puVar37);
                    puVar37 = puVar37 + 1;
                  } while (puVar37 != puVar6);
                  if (*(long *)((long)iVar22.
                                      super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_false>
                                      ._M_cur + 0x18) !=
                      *(long *)((long)iVar22.
                                      super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_false>
                                      ._M_cur + 0x10)) {
                    *(long *)((long)iVar22.
                                    super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_false>
                                    ._M_cur + 0x18) =
                         *(long *)((long)iVar22.
                                         super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_false>
                                         ._M_cur + 0x10);
                  }
                }
              }
              ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                        ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                         auStack_218,curr_local);
              pNVar40 = (Name *)((long)&(pNVar40->super_IString).str._M_len + 1);
            } while ((Expression *)pNVar40 != local_90);
            pEVar29 = (Expression *)
                      (local_88->catchTags).
                      super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.data;
            this = local_40;
            pTVar41 = local_88;
          }
          pTVar23 = (Try *)(((ExpressionList *)&pTVar41->body)->
                           super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ).data;
          (((ExpressionList *)&pTVar41->body)->
          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).data =
               (Expression **)auStack_218;
          p_Var7 = (_Base_ptr)
                   (pTVar41->catchTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.
                   usedElements;
          *(undefined4 *)
           &(pTVar41->catchTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.data =
               prelude._0_4_;
          *(undefined4 *)
           ((long)&(pTVar41->catchTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.
                   data + 4) = prelude._4_4_;
          *(undefined4 *)
           &(pTVar41->catchTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.
            usedElements = local_208._0_4_;
          *(undefined4 *)
           ((long)&(pTVar41->catchTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.
                   usedElements + 4) = local_208._4_4_;
          uVar21 = (((SpecificExpression<(wasm::Expression::Id)1> *)
                    &pTVar41->super_SpecificExpression<(wasm::Expression::Id)52>)->super_Expression)
                   .type.id;
          auStack_218 = (undefined1  [8])pTVar23;
          prelude = pEVar29;
          local_208 = p_Var7;
          if (1 < uVar21) {
            in_R8.id = (uintptr_t)(pTVar41->name).super_IString.str._M_str;
            p_Var27 = std::
                      _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      ::_M_find_before_node
                                (&(this->breakTemps)._M_h,
                                 in_R8.id % (this->breakTemps)._M_h._M_bucket_count,&pTVar41->name,
                                 in_R8.id);
            if ((p_Var27 == (__node_base_ptr)0x0) || (p_Var27->_M_nxt == (_Hash_node_base *)0x0)) {
              auVar14._8_8_ = 0;
              auVar14._0_8_ = uVar21;
              IVar19 = Builder::addVar((Builder *)
                                       (this->
                                       super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                                       ).
                                       super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                       .
                                       super_PostWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                       .
                                       super_Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                       .currFunction,(Function *)0x0,(Name)(auVar14 << 0x40),in_R8);
            }
            else {
              IVar19 = *(Index *)&p_Var27->_M_nxt[3]._M_nxt;
            }
            pNVar40 = (pTVar41->catchTags).
                      super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.data;
            if (pNVar40 == (Name *)0x0) {
              __assert_fail("usedElements > 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                            ,0xd0,
                            "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::back() const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                           );
            }
            ppEVar30 = (((ExpressionList *)&pTVar41->body)->
                       super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).
                       data;
            pEVar29 = ppEVar30[(long)((long)&pNVar40[-1].super_IString.str._M_str + 7)];
            if (1 < (pEVar29->type).id) {
              pLVar25 = Builder::makeLocalSet(&local_38,IVar19,pEVar29);
              ppEVar30[(long)((long)&pNVar40[-1].super_IString.str._M_str + 7)] =
                   (Expression *)pLVar25;
            }
            Block::finalize((Block *)pTVar41,(optional<wasm::Type>)(ZEXT816(1) << 0x40),Unknown);
            pEVar29 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
            pEVar29->_id = LocalGetId;
            *(Index *)(pEVar29 + 1) = IVar19;
            (pEVar29->type).id = uVar21;
            Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>::
            replaceCurrent((Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                            *)item,pEVar29);
            ppEVar30 = SmallVector<wasm::Expression_*,_10UL>::back
                                 (&(local_40->
                                   super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                                   ).
                                   super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                   .expressionStack);
            *ppEVar30 = pEVar29;
            curr_local = (Expression *)pTVar41;
            std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
            emplace_back<wasm::Expression*>
                      ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)&local_78,
                       &curr_local);
          }
          Block::finalize((Block *)pTVar41,(optional<wasm::Type>)(ZEXT816(1) << 0x40),Unknown);
          goto LAB_008613dd;
        }
        if (IVar2 != IfId) {
LAB_00861677:
          handle_unreachable("unexpected expr type",
                             "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Flatten.cpp"
                             ,0xe7);
        }
        pTVar23 = (Try *)getPreludesWithExpression
                                   (this,(Expression *)(local_58->name).super_IString.str._M_len,
                                    (Expression *)local_58);
        pEVar29 = (Expression *)(pTVar41->name).super_IString.str._M_str;
        pEVar26 = pTVar41->body;
        if (pEVar26 == (Expression *)0x0) {
          auStack_218 = (undefined1  [8])0x0;
        }
        else {
          TVar24 = wasm::Type::getLeastUpperBound((pEVar29->type).id,(pEVar26->type).id);
          auStack_218 = (undefined1  [8])0x0;
          if (1 < TVar24.id) {
            auVar9._8_8_ = 0;
            auVar9._0_8_ = TVar24.id;
            local_88 = (Try *)TVar24;
            IVar19 = Builder::addVar((Builder *)
                                     (this->
                                     super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                                     ).
                                     super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                     .
                                     super_PostWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                     .
                                     super_Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                     .currFunction,(Function *)0x0,(Name)(auVar9 << 0x40),in_R8);
            local_80 = (Try *)CONCAT44(local_80._4_4_,IVar19);
            pEVar28 = (Expression *)(pTVar41->name).super_IString.str._M_str;
            if (1 < (pEVar28->type).id) {
              pLVar25 = Builder::makeLocalSet(&local_38,IVar19,pEVar28);
              (pTVar41->name).super_IString.str._M_str = (char *)pLVar25;
            }
            if (1 < (pTVar41->body->type).id) {
              pLVar25 = Builder::makeLocalSet(&local_38,(Index)local_80,pTVar41->body);
              pTVar41->body = (Expression *)pLVar25;
            }
            if (1 < (local_58->super_SpecificExpression<(wasm::Expression::Id)52>).super_Expression.
                    type.id) {
              auStack_218 = (undefined1  [8])pTVar23;
              pTVar23 = (Try *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
              (((SpecificExpression<(wasm::Expression::Id)9> *)
               &pTVar23->super_SpecificExpression<(wasm::Expression::Id)52>)->super_Expression)._id
                   = LocalGetId;
              *(Index *)&(pTVar23->name).super_IString.str._M_len = (Index)local_80;
              (((SpecificExpression<(wasm::Expression::Id)9> *)
               &pTVar23->super_SpecificExpression<(wasm::Expression::Id)52>)->super_Expression).type
              .id = (uintptr_t)local_88;
            }
          }
        }
        pEVar28 = getPreludesWithExpression
                            (this,pEVar29,(Expression *)(pTVar41->name).super_IString.str._M_str);
        (pTVar41->name).super_IString.str._M_str = (char *)pEVar28;
        if (pTVar41->body != (Expression *)0x0) {
          pEVar29 = getPreludesWithExpression(this,pEVar26,pTVar41->body);
          pTVar41->body = pEVar29;
          pEVar29 = pEVar26;
        }
        type__01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._8_8_ = 0;
        type__01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)pEVar29;
        If::finalize((If *)pTVar41,type__01);
        if (auStack_218 != (undefined1  [8])0x0) {
          Visitor<wasm::ReFinalizeNode,_void>::visit
                    ((Visitor<wasm::ReFinalizeNode,_void> *)&curr_local,(Expression *)auStack_218);
          std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                    (&local_78,(value_type *)auStack_218);
        }
        Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>::replaceCurrent
                  ((Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_> *)
                   item,(Expression *)pTVar23);
      }
      else {
        if (IVar2 != LoopId) {
          if (IVar2 != TryId) goto LAB_00861677;
          pEVar29 = local_58->body;
          pEVar1 = &local_58->catchBodies;
          in_R8.id = (local_58->catchBodies).
                     super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                     usedElements;
          __first.index = 0;
          __first.parent = pEVar1;
          __last.index = in_R8.id;
          __last.parent = pEVar1;
          std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
          vector<ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*>::Iterator,void>
                    ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_218,
                     __first,__last,(allocator_type *)&curr_local);
          pTVar23 = (Try *)(pTVar41->super_SpecificExpression<(wasm::Expression::Id)52>).
                           super_Expression.type.id;
          local_80 = pTVar41;
          if ((Try *)0x1 < pTVar23) {
            auVar10._8_8_ = 0;
            auVar10._0_8_ = pTVar23;
            local_90 = pEVar29;
            IVar19 = Builder::addVar((Builder *)
                                     (this->
                                     super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                                     ).
                                     super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                     .
                                     super_PostWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                     .
                                     super_Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                     .currFunction,(Function *)0x0,(Name)(auVar10 << 0x40),in_R8);
            if (1 < (pTVar41->body->type).id) {
              pLVar25 = Builder::makeLocalSet(&local_38,IVar19,pTVar41->body);
              pTVar41->body = (Expression *)pLVar25;
            }
            uVar21 = (pTVar41->catchBodies).
                     super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                     usedElements;
            local_88 = pTVar23;
            if (uVar21 != 0) {
              uVar34 = 1;
              uVar39 = 0;
              do {
                pEVar29 = (pEVar1->
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          ).data[uVar39];
                if (1 < (pEVar29->type).id) {
                  pLVar25 = Builder::makeLocalSet(&local_38,IVar19,pEVar29);
                  uVar21 = (pTVar41->catchBodies).
                           super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           .usedElements;
                  if (uVar21 <= uVar39) goto LAB_008615f4;
                  (pEVar1->
                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).data
                  [uVar39] = (Expression *)pLVar25;
                }
                uVar39 = (ulong)uVar34;
                uVar34 = uVar34 + 1;
              } while (uVar39 < uVar21);
            }
            local_80 = (Try *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
            this = local_40;
            *(undefined1 *)
             &((_Hashtable *)&local_80->super_SpecificExpression<(wasm::Expression::Id)52>)->
              _M_buckets = 8;
            *(Index *)&(local_80->name).super_IString.str._M_len = IVar19;
            ((_Hashtable *)&local_80->super_SpecificExpression<(wasm::Expression::Id)52>)->
            _M_bucket_count = (size_type)local_88;
            curr_local = (Expression *)pTVar41;
            std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
            emplace_back<wasm::Expression*>
                      ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)&local_78,
                       &curr_local);
            pEVar29 = local_90;
          }
          pEVar26 = getPreludesWithExpression(this,pEVar29,pTVar41->body);
          pTVar23 = local_80;
          pTVar41->body = pEVar26;
          if ((pTVar41->catchBodies).
              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
              usedElements != 0) {
            uVar34 = 1;
            uVar21 = 0;
            do {
              pEVar29 = *(Expression **)
                         (&(((SpecificExpression<(wasm::Expression::Id)9> *)auStack_218)->
                           super_Expression)._id + uVar21 * 8);
              pEVar26 = getPreludesWithExpression
                                  (local_40,pEVar29,
                                   (pEVar1->
                                   super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                   ).data[uVar21]);
              uVar39 = (pTVar41->catchBodies).
                       super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                       usedElements;
              if (uVar39 <= uVar21) goto LAB_008615f4;
              (pEVar1->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).
              data[uVar21] = pEVar26;
              uVar21 = (ulong)uVar34;
              uVar34 = uVar34 + 1;
            } while (uVar21 < uVar39);
          }
          type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._8_8_ = 0;
          type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)pEVar29;
          Try::finalize(pTVar41,type_);
          Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>::
          replaceCurrent((Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                          *)item,(Expression *)pTVar23);
          ppEVar30 = SmallVector<wasm::Expression_*,_10UL>::back
                               (&(local_40->
                                 super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                                 ).
                                 super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                 .expressionStack);
          *ppEVar30 = (Expression *)pTVar23;
          if (auStack_218 != (undefined1  [8])0x0) {
            operator_delete((void *)auStack_218,(long)local_208 - (long)auStack_218);
          }
          goto LAB_008613dd;
        }
        uVar21 = (local_58->super_SpecificExpression<(wasm::Expression::Id)52>).super_Expression.
                 type.id;
        pEVar29 = local_58->body;
        pEVar26 = pEVar29;
        pTVar23 = local_58;
        if (1 < uVar21) {
          auVar11._8_8_ = 0;
          auVar11._0_8_ = uVar21;
          IVar19 = Builder::addVar((Builder *)
                                   (this->
                                   super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                                   ).
                                   super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                   .
                                   super_PostWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                   .
                                   super_Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                   .currFunction,(Function *)0x0,(Name)(auVar11 << 0x40),in_R8);
          pLVar25 = Builder::makeLocalSet(&local_38,IVar19,pTVar41->body);
          pTVar41->body = (Expression *)pLVar25;
          pTVar23 = (Try *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
          (((SpecificExpression<(wasm::Expression::Id)9> *)
           &pTVar23->super_SpecificExpression<(wasm::Expression::Id)52>)->super_Expression)._id =
               LocalGetId;
          *(Index *)&(pTVar23->name).super_IString.str._M_len = IVar19;
          (((SpecificExpression<(wasm::Expression::Id)9> *)
           &pTVar23->super_SpecificExpression<(wasm::Expression::Id)52>)->super_Expression).type.id
               = uVar21;
          auStack_218 = (undefined1  [8])pTVar41;
          std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
          emplace_back<wasm::Expression*>
                    ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)&local_78,
                     (Expression **)auStack_218);
          (pTVar41->super_SpecificExpression<(wasm::Expression::Id)52>).super_Expression.type.id = 0
          ;
          pEVar26 = pTVar41->body;
          this = local_40;
        }
        pEVar26 = getPreludesWithExpression(this,pEVar29,pEVar26);
        pTVar41->body = pEVar26;
        type__00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._8_8_ = 0;
        type__00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)pEVar29;
        Loop::finalize((Loop *)pTVar41,type__00);
        Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>::replaceCurrent
                  ((Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_> *)
                   item,(Expression *)pTVar23);
      }
      ppEVar30 = SmallVector<wasm::Expression_*,_10UL>::back
                           (&(this->
                             super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                             ).
                             super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                             .expressionStack);
      *ppEVar30 = (Expression *)pTVar23;
      goto LAB_008613dd;
    }
    if (uVar21 == 0x16) {
      return;
    }
    if (uVar21 == 0x39) {
      uVar5 = curr[1].type.id;
      if (uVar5 == 0) {
        return;
      }
      uVar33 = 0;
      while( true ) {
        for (pbVar36 = *(byte **)(*(long *)(curr + 1) + uVar33 * 8); bVar4 = *pbVar36, bVar4 == 0x51
            ; pbVar36 = *(byte **)(pbVar36 + 0x18)) {
          in_R8.id = (uintptr_t)(*(int *)(pbVar36 + 0x10) - 1U);
          if (1 < *(int *)(pbVar36 + 0x10) - 1U) goto LAB_00860caf;
        }
        in_R8.id = (uintptr_t)(bVar4 - 0x29);
        if (((0x2a < bVar4 - 0x29) || ((0x40000000005U >> (in_R8.id & 0x3f) & 1) == 0)) &&
           (bVar4 != 0xe)) break;
        uVar33 = uVar33 + 1;
        if (uVar33 == uVar5) {
          return;
        }
      }
    }
  }
LAB_00860caf:
  iVar22 = std::
           _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           ::find(&(this->preludes)._M_h,(key_type *)&local_58);
  pFVar35 = local_40;
  pTVar41 = local_58;
  if (iVar22.
      super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_false>
      ._M_cur != (__node_type *)0x0) {
    ppEVar38 = *(pointer *)
                ((long)iVar22.
                       super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_false>
                       ._M_cur + 0x10);
    ppEVar30 = *(Expression ***)
                ((long)iVar22.
                       super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_false>
                       ._M_cur + 0x18);
    ppEVar8 = *(pointer *)
               ((long)iVar22.
                      super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_false>
                      ._M_cur + 0x20);
    *(pointer *)
     ((long)iVar22.
            super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_false>
            ._M_cur + 0x10) =
         local_78.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
         _M_impl.super__Vector_impl_data._M_start;
    *(pointer *)
     ((long)iVar22.
            super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_false>
            ._M_cur + 0x18) =
         local_78.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    *(pointer *)
     ((long)iVar22.
            super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_false>
            ._M_cur + 0x20) =
         local_78.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_78.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_start = ppEVar38;
    local_78.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppEVar30;
    local_78.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = ppEVar8;
  }
  IVar2 = (local_58->super_SpecificExpression<(wasm::Expression::Id)52>).super_Expression._id;
  if (IVar2 == BreakId) {
    expression = (MixedArena *)local_58->body;
    if (expression == (MixedArena *)0x0) goto LAB_008613dd;
    uVar21 = ((Type *)&(expression->chunks).super__Vector_base<void_*,_std::allocator<void_*>_>.
                       _M_impl.super__Vector_impl_data._M_finish)->id;
    if (1 < uVar21) {
      pEVar29 = ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                ::findBreakTarget((ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                   *)item,(Name)(local_58->name).super_IString.str);
      TVar24.id = (pEVar29->type).id;
      IVar19 = getTempForBreakTarget(local_40,(Name)(pTVar41->name).super_IString.str,TVar24);
      auStack_218 = (undefined1  [8])Builder::makeLocalSet(&local_38,IVar19,pTVar41->body);
      std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
      emplace_back<wasm::Expression*>
                ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)&local_78,
                 (Expression **)auStack_218);
      if (uVar21 != TVar24.id) {
        auVar13._8_8_ = 0;
        auVar13._0_8_ = uVar21;
        IVar19 = Builder::addVar((Builder *)
                                 (local_40->
                                 super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                                 ).
                                 super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                 .
                                 super_PostWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                 .
                                 super_Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                 .currFunction,(Function *)0x0,(Name)(auVar13 << 0x40),in_R8);
        iVar20 = ExpressionManipulator::copy
                           ((EVP_PKEY_CTX *)pTVar41->body,
                            (EVP_PKEY_CTX *)
                            (local_40->
                            super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                            ).
                            super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                            .
                            super_PostWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                            .
                            super_Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                            .currModule);
        auStack_218 = (undefined1  [8])
                      Builder::makeLocalSet
                                (&local_38,IVar19,(Expression *)CONCAT44(extraout_var,iVar20));
        std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
        emplace_back<wasm::Expression*>
                  ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)&local_78,
                   (Expression **)auStack_218);
      }
      if ((pTVar41->catchTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.data !=
          (Name *)0x0) {
        auStack_218 = (undefined1  [8])pTVar41;
        std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
        emplace_back<wasm::Expression*>
                  ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)&local_78,
                   (Expression **)auStack_218);
        uVar39 = (pTVar41->super_SpecificExpression<(wasm::Expression::Id)52>).super_Expression.type
                 .id;
        if (uVar39 < 2) {
          if (uVar39 != 1) {
            __assert_fail("br->type == Type::unreachable",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Flatten.cpp"
                          ,0x12a,"void wasm::Flatten::visitExpression(Expression *)");
          }
          pEVar29 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x10,8);
          pEVar29->_id = UnreachableId;
          (pEVar29->type).id = 1;
          Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>::
          replaceCurrent((Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                          *)item,pEVar29);
        }
        else {
          pEVar29 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
          pEVar29->_id = LocalGetId;
          *(Index *)(pEVar29 + 1) = IVar19;
          (pEVar29->type).id = uVar21;
          Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>::
          replaceCurrent((Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                          *)item,pEVar29);
        }
        ppEVar30 = SmallVector<wasm::Expression_*,_10UL>::back
                             (&(local_40->
                               super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                               ).
                               super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                               .expressionStack);
        *ppEVar30 = pEVar29;
      }
      pTVar41->body = (Expression *)0x0;
      Break::finalize((Break *)pTVar41);
      goto LAB_008613dd;
    }
    if (uVar21 != 1) {
      __assert_fail("type == Type::unreachable",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Flatten.cpp"
                    ,0x131,"void wasm::Flatten::visitExpression(Expression *)");
    }
    Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>::replaceCurrent
              ((Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_> *)item,
               (Expression *)expression);
  }
  else if (IVar2 == SwitchId) {
    expression = (local_58->catchTags).allocator;
    if (expression == (MixedArena *)0x0) goto LAB_008613dd;
    TVar24.id = ((Type *)&(expression->chunks).super__Vector_base<void_*,_std::allocator<void_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish)->id;
    if (1 < TVar24.id) {
      auVar12._8_8_ = 0;
      auVar12._0_8_ = TVar24.id;
      IVar19 = Builder::addVar((Builder *)
                               (local_40->
                               super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                               ).
                               super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                               .
                               super_PostWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                               .
                               super_Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                               .currFunction,(Function *)0x0,(Name)(auVar12 << 0x40),in_R8);
      auStack_218 = (undefined1  [8])
                    Builder::makeLocalSet
                              (&local_38,IVar19,(Expression *)(pTVar41->catchTags).allocator);
      std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
      emplace_back<wasm::Expression*>
                ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)&local_78,
                 (Expression **)auStack_218);
      BranchUtils::getUniqueTargets((NameSet *)auStack_218,(BranchUtils *)pTVar41,expr);
      p_Var31 = local_200;
      if (local_200 != (_Rb_tree_node_base *)&prelude) {
        do {
          index = getTempForBreakTarget(pFVar35,(Name)*(string_view *)(p_Var31 + 1),TVar24);
          pEVar29 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
          pEVar29->_id = LocalGetId;
          *(Index *)(pEVar29 + 1) = IVar19;
          (pEVar29->type).id = TVar24.id;
          curr_local = (Expression *)Builder::makeLocalSet(&local_38,index,pEVar29);
          std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
          emplace_back<wasm::Expression*>
                    ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)&local_78,
                     &curr_local);
          p_Var31 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var31);
          pFVar35 = local_40;
        } while (p_Var31 != (_Rb_tree_node_base *)&prelude);
      }
      (pTVar41->catchTags).allocator = (MixedArena *)0x0;
      Switch::finalize((Switch *)pTVar41);
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                   *)auStack_218);
      goto LAB_008613dd;
    }
    if (TVar24.id != 1) {
      __assert_fail("type == Type::unreachable",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Flatten.cpp"
                    ,0x148,"void wasm::Flatten::visitExpression(Expression *)");
    }
    Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>::replaceCurrent
              ((Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_> *)item,
               (Expression *)expression);
  }
  else {
    if ((IVar2 != LocalSetId) || (bVar18 = LocalSet::isTee((LocalSet *)local_58), !bVar18))
    goto LAB_008613dd;
    expression = (MixedArena *)(pTVar41->name).super_IString.str._M_str;
    if (((Type *)&(expression->chunks).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                  super__Vector_impl_data._M_finish)->id != 1) {
      LocalSet::makeSet((LocalSet *)pTVar41);
      auStack_218 = (undefined1  [8])pTVar41;
      std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
      emplace_back<wasm::Expression*>
                ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)&local_78,
                 (Expression **)auStack_218);
      TVar24 = Function::getLocalType
                         ((local_40->
                          super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                          ).
                          super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                          .
                          super_PostWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                          .
                          super_Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                          .currFunction,(Index)(pTVar41->name).super_IString.str._M_len);
      sVar17 = (pTVar41->name).super_IString.str._M_len;
      pEVar29 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
      pEVar29->_id = LocalGetId;
      *(int *)(pEVar29 + 1) = (int)sVar17;
      (pEVar29->type).id = TVar24.id;
      Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>::replaceCurrent
                ((Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_> *)item
                 ,pEVar29);
      ppEVar30 = SmallVector<wasm::Expression_*,_10UL>::back
                           (&(local_40->
                             super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                             ).
                             super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                             .expressionStack);
      *ppEVar30 = pEVar29;
      goto LAB_008613dd;
    }
    Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>::replaceCurrent
              ((Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_> *)item,
               (Expression *)expression);
  }
  ppEVar30 = SmallVector<wasm::Expression_*,_10UL>::back
                       (&(local_40->
                         super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                         ).
                         super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                         .expressionStack);
  *ppEVar30 = (Expression *)expression;
LAB_008613dd:
  IVar2 = (local_58->super_SpecificExpression<(wasm::Expression::Id)52>).super_Expression._id;
  if ((IVar2 != BrOnId) && (IVar2 != TryTableId)) {
    local_58 = (Try *)**(undefined8 **)item;
    Visitor<wasm::ReFinalizeNode,_void>::visit
              ((Visitor<wasm::ReFinalizeNode,_void> *)auStack_218,(Expression *)local_58);
    pFVar35 = local_40;
    uVar21 = (local_58->super_SpecificExpression<(wasm::Expression::Id)52>).super_Expression.type.id
    ;
    if (uVar21 != 0) {
      if (uVar21 == 1) {
        if (local_78.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
            _M_impl.super__Vector_impl_data._M_finish ==
            local_78.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
          _M_realloc_insert<wasm::Expression*const&>
                    ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)&local_78,
                     (iterator)
                     local_78.
                     super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish,(Expression **)&local_58);
        }
        else {
          *local_78.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
           _M_impl.super__Vector_impl_data._M_finish = (Expression *)local_58;
          local_78.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               local_78.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
               _M_impl.super__Vector_impl_data._M_finish + 1;
        }
        pEVar29 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x10,8);
        pEVar29->_id = UnreachableId;
        (pEVar29->type).id = 1;
        Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>::replaceCurrent
                  ((Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_> *)
                   item,pEVar29);
      }
      else {
        auVar15._8_8_ = 0;
        auVar15._0_8_ = uVar21;
        IVar19 = Builder::addVar((Builder *)
                                 (local_40->
                                 super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                                 ).
                                 super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                 .
                                 super_PostWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                 .
                                 super_Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                 .currFunction,(Function *)0x0,(Name)(auVar15 << 0x40),in_R8);
        auStack_218 = (undefined1  [8])
                      Builder::makeLocalSet(&local_38,IVar19,(Expression *)local_58);
        std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
        emplace_back<wasm::Expression*>
                  ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)&local_78,
                   (Expression **)auStack_218);
        pEVar29 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
        pEVar29->_id = LocalGetId;
        *(Index *)(pEVar29 + 1) = IVar19;
        (pEVar29->type).id = uVar21;
        Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>::replaceCurrent
                  ((Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_> *)
                   item,pEVar29);
      }
      ppEVar30 = SmallVector<wasm::Expression_*,_10UL>::back
                           (&(pFVar35->
                             super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                             ).
                             super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                             .expressionStack);
      *ppEVar30 = pEVar29;
    }
    if (local_78.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl
        .super__Vector_impl_data._M_start !=
        local_78.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl
        .super__Vector_impl_data._M_finish) {
      auStack_218 = (undefined1  [8])
                    ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                    ::getParent((ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                 *)item);
      if ((auStack_218 == (undefined1  [8])0x0) ||
         ((uVar21 = (ulong)(((SpecificExpression<(wasm::Expression::Id)9> *)
                            &((Try *)auStack_218)->
                             super_SpecificExpression<(wasm::Expression::Id)52>)->super_Expression).
                           _id, uVar21 < 0x36 && ((0x3000000000000eU >> (uVar21 & 0x3f) & 1) != 0)))
         ) {
        curr_local = *(pFVar35->
                      super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                      ).
                      super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                      .
                      super_PostWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                      .
                      super_Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                      .replacep;
        pmVar32 = std::__detail::
                  _Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)&pFVar35->preludes,&curr_local);
        ppEVar8 = (pmVar32->
                  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        ppEVar38 = (pmVar32->
                   super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
        ppEVar16 = (pmVar32->
                   super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>).
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
        (pmVar32->super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>).
        _M_impl.super__Vector_impl_data._M_start =
             local_78.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
        (pmVar32->super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>).
        _M_impl.super__Vector_impl_data._M_finish =
             local_78.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        (pmVar32->super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage =
             local_78.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
        local_78.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl
        .super__Vector_impl_data._M_start = ppEVar8;
        local_78.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl
        .super__Vector_impl_data._M_finish = ppEVar38;
        local_78.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage = ppEVar16;
      }
      else {
        this_00 = (vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)
                  std::__detail::
                  _Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)&pFVar35->preludes,(key_type *)auStack_218);
        ppEVar8 = local_78.
                  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        if (local_78.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            local_78.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          ppEVar38 = local_78.
                     super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          do {
            curr_local = *ppEVar38;
            __position._M_current = *(Expression ***)(this_00 + 8);
            if (__position._M_current == *(Expression ***)(this_00 + 0x10)) {
              std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
              _M_realloc_insert<wasm::Expression*const&>(this_00,__position,&curr_local);
            }
            else {
              *__position._M_current = curr_local;
              *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
            }
            ppEVar38 = ppEVar38 + 1;
          } while (ppEVar38 != ppEVar8);
        }
      }
    }
    if (local_78.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl
        .super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_78.
                      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_78.
                            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_78.
                            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    return;
  }
  Fatal::Fatal((Fatal *)auStack_218);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_208,"Unsupported instruction for Flatten: ",0x25);
  curr_local = (Expression *)getExpressionName((Expression *)local_58);
  Fatal::operator<<((Fatal *)auStack_218,(char **)&curr_local);
  Fatal::~Fatal((Fatal *)auStack_218);
}

Assistant:

void visitExpression(Expression* curr) {
    std::vector<Expression*> ourPreludes;
    Builder builder(*getModule());

    // Nothing to do for constants and nop.
    if (Properties::isConstantExpression(curr) || curr->is<Nop>()) {
      return;
    }

    if (Properties::isControlFlowStructure(curr)) {
      // handle control flow explicitly. our children do not have control flow,
      // but they do have preludes which we need to set up in the right place

      // no one should have given us preludes, they are on the children
      assert(preludes.find(curr) == preludes.end());

      if (auto* block = curr->dynCast<Block>()) {
        // make a new list, where each item's preludes are added before it
        ExpressionList newList(getModule()->allocator);
        for (auto* item : block->list) {
          auto iter = preludes.find(item);
          if (iter != preludes.end()) {
            auto& itemPreludes = iter->second;
            for (auto* prelude : itemPreludes) {
              newList.push_back(prelude);
            }
            itemPreludes.clear();
          }
          newList.push_back(item);
        }
        block->list.swap(newList);
        // remove a block return value
        auto type = block->type;
        if (type.isConcrete()) {
          // if there is a temp index for breaking to the block, use that
          Index temp;
          auto iter = breakTemps.find(block->name);
          if (iter != breakTemps.end()) {
            temp = iter->second;
          } else {
            temp = builder.addVar(getFunction(), type);
          }
          auto*& last = block->list.back();
          if (last->type.isConcrete()) {
            last = builder.makeLocalSet(temp, last);
          }
          block->finalize(Type::none);
          // and we leave just a get of the value
          auto* rep = builder.makeLocalGet(temp, type);
          replaceCurrent(rep);
          // the whole block is now a prelude
          ourPreludes.push_back(block);
        }
        // the block now has no return value, and may have become unreachable
        block->finalize(Type::none);

      } else if (auto* iff = curr->dynCast<If>()) {
        // condition preludes go before the entire if
        auto* rep = getPreludesWithExpression(iff->condition, iff);
        // arm preludes go in the arms. we must also remove an if value
        auto* originalIfTrue = iff->ifTrue;
        auto* originalIfFalse = iff->ifFalse;
        auto type = iff->ifFalse ? Type::getLeastUpperBound(iff->ifTrue->type,
                                                            iff->ifFalse->type)
                                 : Type::none;
        Expression* prelude = nullptr;
        if (type.isConcrete()) {
          Index temp = builder.addVar(getFunction(), type);
          if (iff->ifTrue->type.isConcrete()) {
            iff->ifTrue = builder.makeLocalSet(temp, iff->ifTrue);
          }
          if (iff->ifFalse->type.isConcrete()) {
            iff->ifFalse = builder.makeLocalSet(temp, iff->ifFalse);
          }
          if (curr->type.isConcrete()) {
            // the whole if (+any preludes from the condition) is now a prelude
            prelude = rep;
            // and we leave just a get of the value
            rep = builder.makeLocalGet(temp, type);
          }
        }
        iff->ifTrue = getPreludesWithExpression(originalIfTrue, iff->ifTrue);
        if (iff->ifFalse) {
          iff->ifFalse =
            getPreludesWithExpression(originalIfFalse, iff->ifFalse);
        }
        iff->finalize();
        if (prelude) {
          ReFinalizeNode().visit(prelude);
          ourPreludes.push_back(prelude);
        }
        replaceCurrent(rep);

      } else if (auto* loop = curr->dynCast<Loop>()) {
        // remove a loop value
        Expression* rep = loop;
        auto* originalBody = loop->body;
        auto type = loop->type;
        if (type.isConcrete()) {
          Index temp = builder.addVar(getFunction(), type);
          loop->body = builder.makeLocalSet(temp, loop->body);
          // and we leave just a get of the value
          rep = builder.makeLocalGet(temp, type);
          // the whole if is now a prelude
          ourPreludes.push_back(loop);
          loop->type = Type::none;
        }
        loop->body = getPreludesWithExpression(originalBody, loop->body);
        loop->finalize();
        replaceCurrent(rep);

      } else if (auto* tryy = curr->dynCast<Try>()) {
        // remove a try value
        Expression* rep = tryy;
        auto* originalBody = tryy->body;
        std::vector<Expression*> originalCatchBodies(tryy->catchBodies.begin(),
                                                     tryy->catchBodies.end());
        auto type = tryy->type;
        if (type.isConcrete()) {
          Index temp = builder.addVar(getFunction(), type);
          if (tryy->body->type.isConcrete()) {
            tryy->body = builder.makeLocalSet(temp, tryy->body);
          }
          for (Index i = 0; i < tryy->catchBodies.size(); i++) {
            if (tryy->catchBodies[i]->type.isConcrete()) {
              tryy->catchBodies[i] =
                builder.makeLocalSet(temp, tryy->catchBodies[i]);
            }
          }
          // and we leave just a get of the value
          rep = builder.makeLocalGet(temp, type);
          // the whole try is now a prelude
          ourPreludes.push_back(tryy);
        }
        tryy->body = getPreludesWithExpression(originalBody, tryy->body);
        for (Index i = 0; i < tryy->catchBodies.size(); i++) {
          tryy->catchBodies[i] = getPreludesWithExpression(
            originalCatchBodies[i], tryy->catchBodies[i]);
        }
        tryy->finalize();
        replaceCurrent(rep);

      } else {
        WASM_UNREACHABLE("unexpected expr type");
      }

    } else {
      // for anything else, there may be existing preludes
      auto iter = preludes.find(curr);
      if (iter != preludes.end()) {
        ourPreludes.swap(iter->second);
      }

      // special handling
      if (auto* set = curr->dynCast<LocalSet>()) {
        if (set->isTee()) {
          // we disallow local.tee
          if (set->value->type == Type::unreachable) {
            replaceCurrent(set->value); // trivial, no set happens
          } else {
            // use a set in a prelude + a get
            set->makeSet();
            ourPreludes.push_back(set);
            Type localType = getFunction()->getLocalType(set->index);
            replaceCurrent(builder.makeLocalGet(set->index, localType));
          }
        }

      } else if (auto* br = curr->dynCast<Break>()) {
        if (br->value) {
          auto type = br->value->type;
          if (type.isConcrete()) {
            // we are sending a value. use a local instead
            Type blockType = findBreakTarget(br->name)->type;
            Index temp = getTempForBreakTarget(br->name, blockType);
            ourPreludes.push_back(builder.makeLocalSet(temp, br->value));

            // br_if leaves a value on the stack if not taken, which later can
            // be the last element of the enclosing innermost block and flow
            // out. The local we created using 'getTempForBreakTarget' returns
            // the return type of the block this branch is targetting, which may
            // not be the same with the innermost block's return type. For
            // example,
            // (block $any (result anyref)
            //   (block (result funcref)
            //     (local.tee $0
            //       (br_if $any
            //         (ref.null func)
            //         (i32.const 0)
            //       )
            //     )
            //   )
            // )
            // In this case we need two locals to store (ref.null); one with
            // funcref type that's for the target block ($label0) and one more
            // with anyref type in case for flowing out. Here we create the
            // second 'flowing out' local in case two block's types are
            // different.
            if (type != blockType) {
              temp = builder.addVar(getFunction(), type);
              ourPreludes.push_back(builder.makeLocalSet(
                temp, ExpressionManipulator::copy(br->value, *getModule())));
            }

            if (br->condition) {
              // the value must also flow out
              ourPreludes.push_back(br);
              if (br->type.isConcrete()) {
                replaceCurrent(builder.makeLocalGet(temp, type));
              } else {
                assert(br->type == Type::unreachable);
                replaceCurrent(builder.makeUnreachable());
              }
            }
            br->value = nullptr;
            br->finalize();
          } else {
            assert(type == Type::unreachable);
            // we don't need the br at all
            replaceCurrent(br->value);
          }
        }

      } else if (auto* sw = curr->dynCast<Switch>()) {
        if (sw->value) {
          auto type = sw->value->type;
          if (type.isConcrete()) {
            // we are sending a value. use a local instead
            Index temp = builder.addVar(getFunction(), type);
            ourPreludes.push_back(builder.makeLocalSet(temp, sw->value));
            // we don't know which break target will be hit - assign to them all
            auto names = BranchUtils::getUniqueTargets(sw);
            for (auto name : names) {
              ourPreludes.push_back(
                builder.makeLocalSet(getTempForBreakTarget(name, type),
                                     builder.makeLocalGet(temp, type)));
            }
            sw->value = nullptr;
            sw->finalize();
          } else {
            assert(type == Type::unreachable);
            // we don't need the br at all
            replaceCurrent(sw->value);
          }
        }
      }
    }

    if (curr->is<BrOn>() || curr->is<TryTable>()) {
      Fatal() << "Unsupported instruction for Flatten: "
              << getExpressionName(curr);
    }

    // continue for general handling of everything, control flow or otherwise
    curr = getCurrent(); // we may have replaced it
    // we have changed children
    ReFinalizeNode().visit(curr);
    if (curr->type == Type::unreachable) {
      ourPreludes.push_back(curr);
      replaceCurrent(builder.makeUnreachable());
    } else if (curr->type.isConcrete()) {
      // use a local
      auto type = curr->type;
      Index temp = builder.addVar(getFunction(), type);
      ourPreludes.push_back(builder.makeLocalSet(temp, curr));
      replaceCurrent(builder.makeLocalGet(temp, type));
    }

    // next, finish up: migrate our preludes if we can
    if (!ourPreludes.empty()) {
      auto* parent = getParent();
      if (parent && !Properties::isControlFlowStructure(parent)) {
        auto& parentPreludes = preludes[parent];
        for (auto* prelude : ourPreludes) {
          parentPreludes.push_back(prelude);
        }
      } else {
        // keep our preludes, parent will handle them
        preludes[getCurrent()].swap(ourPreludes);
      }
    }
  }